

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O1

void * my_numbox_new(t_symbol *s,int argc,t_atom *argv)

{
  undefined1 *puVar1;
  t_iem_fstyle_flags tVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  t_my_numbox *x;
  _glist *p_Var6;
  _clock *p_Var7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  t_float tVar13;
  t_float tVar14;
  int local_8c;
  uint local_88;
  double local_80;
  double local_78;
  t_iemgui_drawfunctions local_68;
  
  x = (t_my_numbox *)iemgui_new(my_numbox_class);
  p_Var6 = canvas_getcurrent();
  local_88 = 0;
  iVar3 = sys_zoomfontheight(p_Var6->gl_font,1,0);
  p_Var6 = canvas_getcurrent();
  iVar4 = sys_zoomfontheight(p_Var6->gl_font,1,0);
  iVar11 = (x->x_gui).x_fontsize;
  local_68.draw_new = my_numbox_draw_new;
  local_68.draw_config = my_numbox_draw_config;
  local_68.draw_iolets = (t_iemfunptr)0x0;
  local_68.draw_update = my_numbox_draw_update;
  local_68.draw_select = my_numbox_draw_select;
  local_68.draw_erase = (t_iemdrawfunptr)0x0;
  local_68.draw_move = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions((t_iemgui *)x,&local_68);
  if (((((((argc < 0x11) || (argv->a_type != A_FLOAT)) || (argv[1].a_type != A_FLOAT)) ||
        ((argv[2].a_type != A_FLOAT || (argv[3].a_type != A_FLOAT)))) ||
       ((argv[4].a_type != A_FLOAT ||
        ((argv[5].a_type != A_FLOAT || (1 < argv[6].a_type - A_FLOAT)))))) ||
      (1 < argv[7].a_type - A_FLOAT)) ||
     ((((1 < argv[8].a_type - A_FLOAT || (argv[9].a_type != A_FLOAT)) ||
       (argv[10].a_type != A_FLOAT)) ||
      (((argv[0xb].a_type != A_FLOAT || (argv[0xc].a_type != A_FLOAT)) ||
       (argv[0x10].a_type != A_FLOAT)))))) {
    iVar12 = (int)((double)(iVar3 * 0xe + 0x46) / 15.0);
    local_8c = (int)((double)(iVar4 * -8 + -0x28) / 15.0);
    iemgui_new_getnames((t_iemgui *)x,6,(t_atom *)0x0);
    tVar13 = 0.0;
    local_80 = 1e+37;
    local_78 = -1e+37;
    iVar4 = 5;
    iVar3 = 0;
  }
  else {
    tVar13 = atom_getfloatarg(0,argc,argv);
    iVar4 = (int)tVar13;
    tVar13 = atom_getfloatarg(1,argc,argv);
    iVar12 = (int)tVar13;
    tVar13 = atom_getfloatarg(2,argc,argv);
    local_78 = (double)tVar13;
    tVar13 = atom_getfloatarg(3,argc,argv);
    local_80 = (double)tVar13;
    tVar14 = atom_getfloatarg(4,argc,argv);
    tVar13 = atom_getfloatarg(5,argc,argv);
    iem_inttosymargs(&(x->x_gui).x_isa,(int)tVar13);
    iemgui_new_getnames((t_iemgui *)x,6,argv);
    tVar13 = atom_getfloatarg(9,argc,argv);
    iVar3 = (int)tVar13;
    tVar13 = atom_getfloatarg(10,argc,argv);
    local_8c = (int)tVar13;
    tVar13 = atom_getfloatarg(0xb,argc,argv);
    iem_inttofstyle(&(x->x_gui).x_fsf,(int)tVar13);
    tVar13 = atom_getfloatarg(0xc,argc,argv);
    iVar11 = (int)tVar13;
    iemgui_all_loadcolors((t_iemgui *)x,argv + 0xd,argv + 0xe,argv + 0xf);
    tVar13 = atom_getfloatarg(0x10,argc,argv);
    local_88 = (uint)((int)tVar14 != 0);
  }
  iVar5 = 0x100;
  if ((argc == 0x12) && (argv[0x11].a_type == A_FLOAT)) {
    tVar14 = atom_getfloatarg(0x11,0x12,argv);
    iVar5 = (int)tVar14;
  }
  uVar8 = (uint)((x->x_gui).x_snd != (t_symbol *)0x0) << 7;
  tVar2 = (x->x_gui).x_fsf;
  uVar9 = (uint)((x->x_gui).x_rcv != (t_symbol *)0x0) << 6;
  (x->x_gui).x_fsf = (t_iem_fstyle_flags)(uVar9 | (uint)tVar2 & 0xffffff3f | uVar8);
  tVar14 = 0.0;
  if (((uint)(x->x_gui).x_isa & 1) != 0) {
    tVar14 = tVar13;
  }
  x->x_val = tVar14;
  x->x_lin0_log1 = local_88;
  iVar10 = 10;
  if (10 < iVar5) {
    iVar10 = iVar5;
  }
  x->x_log_height = iVar10;
  if (((uint)tVar2 & 0x3f) == 2) {
    builtin_strncpy((x->x_gui).x_font,"times",6);
  }
  else if (((uint)tVar2 & 0x3f) == 1) {
    builtin_strncpy((x->x_gui).x_font,"helvetica",10);
  }
  else {
    (x->x_gui).x_fsf = (t_iem_fstyle_flags)(uVar9 | (uint)tVar2 & 0xffffff00 | uVar8);
    strcpy((x->x_gui).x_font,sys_font);
  }
  if (((uint)(x->x_gui).x_fsf & 0x40) != 0) {
    pd_bind((t_pd *)x,(x->x_gui).x_rcv);
  }
  (x->x_gui).x_ldx = iVar3;
  (x->x_gui).x_ldy = local_8c;
  iVar3 = 4;
  if (4 < iVar11) {
    iVar3 = iVar11;
  }
  iVar11 = 1;
  if (1 < iVar4) {
    iVar11 = iVar4;
  }
  (x->x_gui).x_fontsize = iVar3;
  x->x_numwidth = iVar11;
  iVar11 = 8;
  if (8 < iVar12) {
    iVar11 = iVar12;
  }
  (x->x_gui).x_h = iVar11;
  x->x_buf[0] = '\0';
  my_numbox_check_minmax(x,local_78,local_80);
  iemgui_verify_snd_ne_rcv((t_iemgui *)x);
  p_Var7 = clock_new(x,my_numbox_tick_wait);
  x->x_clock_wait = p_Var7;
  puVar1 = &(x->x_gui).x_fsf.field_0x3;
  *puVar1 = *puVar1 & 0xf7;
  iemgui_newzoom((t_iemgui *)x);
  uVar8 = (uint)(x->x_gui).x_fsf & 0x3f;
  iVar11 = 0x1f;
  if (uVar8 == 2) {
    iVar11 = 0x19;
  }
  iVar3 = 0x1b;
  if (uVar8 != 1) {
    iVar3 = iVar11;
  }
  iVar11 = (x->x_gui).x_h;
  iVar4 = ((x->x_gui).x_glist)->gl_zoom;
  (x->x_gui).x_w =
       ((int)(CONCAT44(iVar11 - (iVar11 >> 0x1f) >> 0x1f,iVar11 / 2) / (long)iVar4) +
        (x->x_numwidth * (x->x_gui).x_fontsize * iVar3) / 0x24 + 4) * iVar4;
  outlet_new((t_object *)x,&s_float);
  return x;
}

Assistant:

static void *my_numbox_new(t_symbol *s, int argc, t_atom *argv)
{
    t_my_numbox *x = (t_my_numbox *)iemgui_new(my_numbox_class);
    int w = 5, h = 14 * IEM_GUI_DEFAULTSIZE_SCALE;
    int lilo = 0, ldx = 0, ldy = -8 * IEM_GUI_DEFAULTSIZE_SCALE;
    int fs = x->x_gui.x_fontsize;
    int log_height = 256;
    double min = -1.0e+37, max = 1.0e+37, v = 0.0;

    IEMGUI_SETDRAWFUNCTIONS(x, my_numbox);

    if((argc >= 17)&&IS_A_FLOAT(argv,0)&&IS_A_FLOAT(argv,1)
       &&IS_A_FLOAT(argv,2)&&IS_A_FLOAT(argv,3)
       &&IS_A_FLOAT(argv,4)&&IS_A_FLOAT(argv,5)
       &&(IS_A_SYMBOL(argv,6)||IS_A_FLOAT(argv,6))
       &&(IS_A_SYMBOL(argv,7)||IS_A_FLOAT(argv,7))
       &&(IS_A_SYMBOL(argv,8)||IS_A_FLOAT(argv,8))
       &&IS_A_FLOAT(argv,9)&&IS_A_FLOAT(argv,10)
       &&IS_A_FLOAT(argv,11)&&IS_A_FLOAT(argv,12)&&IS_A_FLOAT(argv,16))
    {
        w = (int)atom_getfloatarg(0, argc, argv);
        h = (int)atom_getfloatarg(1, argc, argv);
        min = (double)atom_getfloatarg(2, argc, argv);
        max = (double)atom_getfloatarg(3, argc, argv);
        lilo = (int)atom_getfloatarg(4, argc, argv);
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(5, argc, argv));
        iemgui_new_getnames(&x->x_gui, 6, argv);
        ldx = (int)atom_getfloatarg(9, argc, argv);
        ldy = (int)atom_getfloatarg(10, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(11, argc, argv));
        fs = (int)atom_getfloatarg(12, argc, argv);
        iemgui_all_loadcolors(&x->x_gui, argv+13, argv+14, argv+15);
        v = atom_getfloatarg(16, argc, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 6, 0);
    if((argc == 18)&&IS_A_FLOAT(argv,17))
    {
        log_height = (int)atom_getfloatarg(17, argc, argv);
    }
    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if(x->x_gui.x_isa.x_loadinit)
        x->x_val = v;
    else
        x->x_val = 0.0;
    if(lilo != 0) lilo = 1;
    x->x_lin0_log1 = lilo;
    if(log_height < 10)
        log_height = 10;
    x->x_log_height = log_height;
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    if(x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < MINFONT)?MINFONT:fs;
    if(w < MINDIGITS)
        w = MINDIGITS;
    x->x_numwidth = w;
    if(h < IEM_GUI_MINSIZE)
        h = IEM_GUI_MINSIZE;
    x->x_gui.x_h = h;
    x->x_buf[0] = 0;
    my_numbox_check_minmax(x, min, max);
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    x->x_clock_wait = clock_new(x, (t_method)my_numbox_tick_wait);
    x->x_gui.x_fsf.x_change = 0;
    iemgui_newzoom(&x->x_gui);
    my_numbox_calc_fontwidth(x);
    outlet_new(&x->x_gui.x_obj, &s_float);
    return (x);
}